

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_triag_mesh_builder.h
# Opt level: O0

void __thiscall
lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
          (TPTriagMeshBuilder *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
          *mesh_factory)

{
  int iVar1;
  pointer pMVar2;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [392];
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_20;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *local_18;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *mesh_factory_local
  ;
  TPTriagMeshBuilder *this_local;
  
  local_18 = mesh_factory;
  mesh_factory_local =
       (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)this;
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
            (&local_20,mesh_factory);
  StructuredMeshBuilder::StructuredMeshBuilder(&this->super_StructuredMeshBuilder,&local_20);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_20);
  (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder =
       (_func_int **)&PTR_Build_0050c8d0;
  pMVar2 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
           operator->(&(this->super_StructuredMeshBuilder).mesh_factory_);
  iVar1 = (**pMVar2->_vptr_MeshFactory)();
  if (iVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"TPTriagMeshBuilder can only construct meshes with DimWorld==2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"mesh_factory_->DimWorld() == 2",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x23,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x23,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  return;
}

Assistant:

explicit TPTriagMeshBuilder(std::unique_ptr<mesh::MeshFactory> mesh_factory)
      : StructuredMeshBuilder(std::move(mesh_factory)) {
    LF_ASSERT_MSG(
        mesh_factory_->DimWorld() == 2,
        "TPTriagMeshBuilder can only construct meshes with DimWorld==2");
  }